

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O3

Id __thiscall
anon_unknown.dwarf_12a4996::TGlslangToSpvTraverser::createAtomicOperation
          (TGlslangToSpvTraverser *this,TOperator op,Decoration param_2,Id typeId,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *operands,TBasicType typeProxy,
          CoherentFlags *lvalueCoherentFlags,TType *opType)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  TGlslangToSpvTraverser *pTVar10;
  Decoration typeId_00;
  long *plVar11;
  int iVar12;
  Id IVar13;
  Id IVar14;
  Id IVar15;
  uint uVar16;
  undefined4 in_register_0000000c;
  uint *puVar17;
  Builder *this_00;
  undefined4 in_register_00000034;
  undefined4 in_register_0000008c;
  uint uVar18;
  Id valueId;
  vector<unsigned_int,_std::allocator<unsigned_int>_> spvAtomicOperands;
  Id semanticsId;
  Id semanticsId2;
  Id compareId;
  Op local_94;
  uint local_8c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  TGlslangToSpvTraverser *local_68;
  Id local_5c;
  Id local_58;
  Id local_54;
  uint local_50;
  uint local_4c;
  Decoration local_48;
  uint local_44;
  undefined8 local_40;
  long *local_38;
  
  local_40 = CONCAT44(in_register_00000034,op);
  local_38 = (long *)CONCAT44(in_register_0000000c,typeId);
  uVar18 = (uint)operands;
  local_68 = this;
  local_48 = param_2;
  switch(op) {
  case EOpAtomicAdd:
  case EOpAtomicCounterAdd:
    goto switchD_00447b77_caseD_12d;
  case EOpAtomicSubtract:
  case EOpAtomicCounterSubtract:
    local_94 = OpAtomicISub;
    break;
  case EOpAtomicMin:
  case EOpAtomicCounterMin:
switchD_00447b77_caseD_12f:
    if (2 < uVar18 - 1) {
      local_94 = (uVar18 & 0xfffffffd) == 9 | OpAtomicSMin;
      break;
    }
    if (uVar18 != 3) {
      spv::Builder::addExtension(&this->builder,"SPV_EXT_shader_atomic_float_min_max");
      if (uVar18 == 1) {
        local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_88.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,0x15ec);
      }
      else {
        local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_88.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,0x15ed);
      }
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                  *)&(this->builder).capabilities,(Capability *)&local_88);
      local_94 = OpAtomicFMinEXT;
      goto LAB_00447fa5;
    }
    iVar12 = (**(code **)(*(long *)lvalueCoherentFlags + 0x60))(lvalueCoherentFlags);
    if ((iVar12 == 2) ||
       (iVar12 = (**(code **)(*(long *)lvalueCoherentFlags + 0x60))(lvalueCoherentFlags),
       iVar12 == 4)) {
      spv::Builder::addExtension(&this->builder,"SPV_NV_shader_atomic_fp16_vector");
      local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_88.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._4_4_,0x151c);
    }
    else {
      spv::Builder::addExtension(&this->builder,"SPV_EXT_shader_atomic_float_min_max");
      local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_88.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._4_4_,0x15f0);
    }
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,(Capability *)&local_88);
    local_94 = OpAtomicFMinEXT;
    goto LAB_0044857d;
  case EOpAtomicMax:
  case EOpAtomicCounterMax:
switchD_00447b77_caseD_130:
    if (2 < uVar18 - 1) {
      local_94 = (uVar18 & 0xfffffffd) == 9 | OpAtomicSMax;
      break;
    }
    if (uVar18 == 3) {
      iVar12 = (**(code **)(*(long *)lvalueCoherentFlags + 0x60))(lvalueCoherentFlags);
      if ((iVar12 == 2) ||
         (iVar12 = (**(code **)(*(long *)lvalueCoherentFlags + 0x60))(lvalueCoherentFlags),
         iVar12 == 4)) {
        spv::Builder::addExtension(&this->builder,"SPV_NV_shader_atomic_fp16_vector");
        local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_88.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,0x151c);
      }
      else {
        spv::Builder::addExtension(&this->builder,"SPV_EXT_shader_atomic_float_min_max");
        local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_88.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,0x15f0);
      }
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                  *)&(this->builder).capabilities,(Capability *)&local_88);
      local_94 = OpAtomicFMaxEXT;
      goto LAB_0044857d;
    }
    spv::Builder::addExtension(&this->builder,"SPV_EXT_shader_atomic_float_min_max");
    if (uVar18 == 1) {
      local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_88.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._4_4_,0x15ec);
    }
    else {
      local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_88.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._4_4_,0x15ed);
    }
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,(Capability *)&local_88);
    local_94 = OpAtomicFMaxEXT;
    goto LAB_00447fa5;
  case EOpAtomicAnd:
  case EOpAtomicCounterAnd:
switchD_00447b77_caseD_131:
    local_94 = OpAtomicAnd;
    break;
  case EOpAtomicOr:
  case EOpAtomicCounterOr:
switchD_00447b77_caseD_132:
    local_94 = OpAtomicOr;
    break;
  case EOpAtomicXor:
  case EOpAtomicCounterXor:
switchD_00447b77_caseD_133:
    local_94 = OpAtomicXor;
    break;
  case EOpAtomicExchange:
  case EOpAtomicCounterExchange:
switchD_00447b77_caseD_134:
    if (uVar18 == 3) {
      iVar12 = (**(code **)(*(long *)lvalueCoherentFlags + 0x60))(lvalueCoherentFlags);
      if ((iVar12 == 2) ||
         (iVar12 = (**(code **)(*(long *)lvalueCoherentFlags + 0x60))(lvalueCoherentFlags),
         iVar12 == 4)) {
        spv::Builder::addExtension(&this->builder,"SPV_NV_shader_atomic_fp16_vector");
        local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_88.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,0x151c);
        std::
        _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
        ::_M_insert_unique<spv::Capability_const&>
                  ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                    *)&(this->builder).capabilities,(Capability *)&local_88);
      }
      local_94 = OpAtomicExchange;
      goto LAB_0044857d;
    }
    local_94 = OpAtomicExchange;
    break;
  case EOpAtomicCompSwap:
  case EOpAtomicCounterCompSwap:
switchD_00447b77_caseD_135:
    local_94 = OpAtomicCompareExchange;
    bVar9 = true;
    bVar7 = false;
    bVar4 = 1;
    goto LAB_00447e37;
  case EOpAtomicLoad:
  case EOpAtomicCounter:
switchD_00447b77_caseD_136:
    local_94 = OpAtomicLoad;
    bVar7 = true;
    bVar9 = false;
    bVar4 = 0;
    goto LAB_00447e37;
  case EOpAtomicStore:
switchD_00447b77_caseD_137:
    local_94 = OpAtomicStore;
    bVar4 = 1;
    bVar3 = false;
    bVar2 = false;
    bVar9 = false;
    bVar7 = false;
    bVar5 = 1;
    bVar6 = 1;
    bVar8 = true;
    goto LAB_00447e4b;
  case EOpAtomicCounterIncrement:
    local_94 = OpAtomicIIncrement;
    bVar3 = true;
    bVar9 = false;
    bVar7 = false;
    bVar4 = 1;
    bVar5 = 0;
    goto LAB_00447e3d;
  case EOpAtomicCounterDecrement:
    local_94 = OpAtomicIDecrement;
    bVar2 = true;
    bVar3 = false;
    bVar9 = false;
    bVar7 = false;
    bVar4 = 1;
    bVar5 = 1;
    bVar6 = 0;
    goto LAB_00447e43;
  default:
    switch(op) {
    case EOpImageAtomicAdd:
      goto switchD_00447b77_caseD_12d;
    case EOpImageAtomicMin:
      goto switchD_00447b77_caseD_12f;
    case EOpImageAtomicMax:
      goto switchD_00447b77_caseD_130;
    case EOpImageAtomicAnd:
      goto switchD_00447b77_caseD_131;
    case EOpImageAtomicOr:
      goto switchD_00447b77_caseD_132;
    case EOpImageAtomicXor:
      goto switchD_00447b77_caseD_133;
    case EOpImageAtomicExchange:
      goto switchD_00447b77_caseD_134;
    case EOpImageAtomicCompSwap:
      goto switchD_00447b77_caseD_135;
    case EOpImageAtomicLoad:
      goto switchD_00447b77_caseD_136;
    case EOpImageAtomicStore:
      goto switchD_00447b77_caseD_137;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                    ,0x20a1,
                    "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createAtomicOperation(glslang::TOperator, spv::Decoration, spv::Id, std::vector<spv::Id> &, glslang::TBasicType, const spv::Builder::AccessChain::CoherentFlags &, const glslang::TType &)"
                   );
    }
  }
LAB_00447e22:
  bVar4 = 1;
  bVar9 = false;
  bVar7 = false;
LAB_00447e37:
  bVar3 = false;
  bVar5 = 1;
LAB_00447e3d:
  bVar2 = false;
  bVar6 = 1;
LAB_00447e43:
  bVar8 = false;
LAB_00447e4b:
  if ((uVar18 & 0xfffffffe) == 10) {
    local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,0xc);
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,(Capability *)&local_88);
  }
LAB_00447fd3:
  uVar18 = 0;
  local_50 = 0;
  local_8c = 0;
  bVar1 = this->glslangIntermediate->useVulkanMemoryModel;
  this_00 = &this->builder;
  IVar13 = spv::Builder::makeIntegerType(this_00,0x20,false);
  IVar13 = spv::Builder::makeIntConstant(this_00,IVar13,(uint)bVar1 * 4 + 1,false);
  if ((*(byte *)CONCAT44(in_register_0000008c,typeProxy) & 0x80) != 0) {
    uVar18 = (uint)local_68->glslangIntermediate->useVulkanMemoryModel << 0xf;
  }
  local_58 = IVar13;
  IVar14 = spv::Builder::makeIntegerType(this_00,0x20,false);
  IVar15 = spv::Builder::makeIntConstant(this_00,IVar14,uVar18,false);
  plVar11 = local_38;
  pTVar10 = local_68;
  puVar17 = (uint *)*local_38;
  local_4c = *puVar17;
  IVar14 = IVar15;
  local_5c = IVar15;
  local_54 = IVar15;
  local_44 = local_4c;
  if (!bVar2 && !bVar3) {
    if (bVar9) {
      local_50 = puVar17[1];
      local_8c = puVar17[2];
      if (0xc < (ulong)(local_38[1] - (long)puVar17)) {
        IVar13 = puVar17[3];
        local_58 = IVar13;
        uVar18 = spv::Builder::getConstantScalar(this_00,puVar17[4]);
        uVar16 = spv::Builder::getConstantScalar(this_00,*(Id *)(*plVar11 + 0x14));
        IVar14 = spv::Builder::makeIntegerType(this_00,0x20,false);
        IVar14 = spv::Builder::makeIntConstant(this_00,IVar14,uVar18 | uVar16,false);
        local_5c = IVar14;
        uVar18 = spv::Builder::getConstantScalar(this_00,*(Id *)(*plVar11 + 0x18));
        uVar16 = spv::Builder::getConstantScalar(this_00,*(Id *)(*plVar11 + 0x1c));
        IVar15 = spv::Builder::makeIntegerType(this_00,0x20,false);
        IVar15 = spv::Builder::makeIntConstant(this_00,IVar15,uVar18 | uVar16,false);
        local_54 = IVar15;
      }
    }
    else if (bVar7) {
      if (4 < (ulong)(local_38[1] - (long)puVar17)) {
        IVar13 = puVar17[1];
        local_58 = IVar13;
        uVar18 = spv::Builder::getConstantScalar(this_00,puVar17[2]);
        IVar14 = *(Id *)(*plVar11 + 0xc);
LAB_004483dd:
        uVar16 = spv::Builder::getConstantScalar(this_00,IVar14);
        IVar14 = spv::Builder::makeIntegerType(this_00,0x20,false);
        IVar14 = spv::Builder::makeIntConstant(this_00,IVar14,uVar18 | uVar16,false);
        local_5c = IVar14;
      }
    }
    else {
      local_8c = puVar17[1];
      if (8 < (ulong)(local_38[1] - (long)puVar17)) {
        IVar13 = puVar17[2];
        local_58 = IVar13;
        uVar18 = spv::Builder::getConstantScalar(this_00,puVar17[3]);
        IVar14 = *(Id *)(*plVar11 + 0x10);
        goto LAB_004483dd;
      }
    }
  }
  uVar18 = spv::Builder::getConstantScalar(this_00,IVar14);
  uVar16 = spv::Builder::getConstantScalar(this_00,IVar15);
  if (((uVar16 | uVar18) & 0xf000) != 0) {
    local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,0x14e1);
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(pTVar10->builder).capabilities,(Capability *)&local_88);
  }
  uVar18 = spv::Builder::getConstantScalar(this_00,IVar13);
  typeId_00 = local_48;
  if (uVar18 == 5) {
    local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,0x14e1);
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(pTVar10->builder).capabilities,(Capability *)&local_88);
  }
  if ((pTVar10->glslangIntermediate->useVulkanMemoryModel == true) &&
     (uVar18 = spv::Builder::getConstantScalar(this_00,IVar13), uVar18 == 1)) {
    local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,0x14e2);
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(pTVar10->builder).capabilities,(Capability *)&local_88);
  }
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&local_88,6);
  if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_88,
               (iterator)
               local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_44);
  }
  else {
    *local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = local_4c;
    local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_88,
               (iterator)
               local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_58);
  }
  else {
    *local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = IVar13;
    local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_88,
               (iterator)
               local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_5c);
  }
  else {
    *local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = IVar14;
    local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  if (bVar9) {
    if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_88,
                 (iterator)
                 local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_54);
    }
    else {
      *local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = local_54;
      local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_88,
                 (iterator)
                 local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_8c);
    }
    else {
      *local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = local_8c;
      local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    uVar18 = local_50;
    if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      puVar17 = &local_50;
LAB_00448424:
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_88,
                 (iterator)
                 local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,puVar17);
      goto LAB_00448429;
    }
  }
  else {
    if (!(bool)(bVar6 & bVar5 & bVar4)) goto LAB_00448429;
    uVar18 = local_8c;
    if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      puVar17 = &local_8c;
      goto LAB_00448424;
    }
  }
  *local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_finish = uVar18;
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish + 1;
LAB_00448429:
  if (bVar8) {
    spv::Builder::createNoResultOp(this_00,OpAtomicStore,&local_88);
    IVar13 = 0;
  }
  else {
    IVar13 = spv::Builder::createOp(this_00,local_94,typeId_00,&local_88);
    if ((int)local_40 == 0x139) {
      IVar14 = spv::Builder::makeIntegerType(this_00,0x20,true);
      IVar14 = spv::Builder::makeIntConstant(this_00,IVar14,1,false);
      IVar13 = spv::Builder::createBinOp(this_00,OpISub,typeId_00,IVar13,IVar14);
    }
  }
  if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return IVar13;
switchD_00447b77_caseD_12d:
  if (2 < uVar18 - 1) {
    local_94 = OpAtomicIAdd;
    goto LAB_00447e22;
  }
  if (uVar18 == 3) {
    iVar12 = (**(code **)(*(long *)lvalueCoherentFlags + 0x60))(lvalueCoherentFlags);
    if ((iVar12 == 2) ||
       (iVar12 = (**(code **)(*(long *)lvalueCoherentFlags + 0x60))(lvalueCoherentFlags),
       iVar12 == 4)) {
      spv::Builder::addExtension(&this->builder,"SPV_NV_shader_atomic_fp16_vector");
      local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_88.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._4_4_,0x151c);
    }
    else {
      spv::Builder::addExtension(&this->builder,"SPV_EXT_shader_atomic_float_add");
      spv::Builder::addExtension(&this->builder,"SPV_EXT_shader_atomic_float16_add");
      local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_88.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._4_4_,0x17cf);
    }
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,(Capability *)&local_88);
    local_94 = OpAtomicFAddEXT;
LAB_0044857d:
    bVar6 = 1;
    bVar8 = false;
    bVar5 = 1;
    bVar4 = 1;
    bVar7 = false;
    bVar9 = false;
    bVar2 = false;
    bVar3 = false;
  }
  else {
    spv::Builder::addExtension(&this->builder,"SPV_EXT_shader_atomic_float_add");
    if (uVar18 == 1) {
      local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_88.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._4_4_,0x1791);
    }
    else {
      local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_88.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._4_4_,0x1792);
    }
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,(Capability *)&local_88);
    local_94 = OpAtomicFAddEXT;
LAB_00447fa5:
    bVar6 = 1;
    bVar8 = false;
    bVar5 = 1;
    bVar4 = 1;
    bVar7 = false;
    bVar9 = false;
    bVar2 = false;
    bVar3 = false;
    this = local_68;
  }
  goto LAB_00447fd3;
}

Assistant:

spv::Id TGlslangToSpvTraverser::createAtomicOperation(glslang::TOperator op, spv::Decoration /*precision*/,
    spv::Id typeId, std::vector<spv::Id>& operands, glslang::TBasicType typeProxy,
    const spv::Builder::AccessChain::CoherentFlags &lvalueCoherentFlags, const glslang::TType &opType)
{
    spv::Op opCode = spv::OpNop;

    switch (op) {
    case glslang::EOpAtomicAdd:
    case glslang::EOpImageAtomicAdd:
    case glslang::EOpAtomicCounterAdd:
        opCode = spv::OpAtomicIAdd;
        if (typeProxy == glslang::EbtFloat16 || typeProxy == glslang::EbtFloat || typeProxy == glslang::EbtDouble) {
            opCode = spv::OpAtomicFAddEXT;
            if (typeProxy == glslang::EbtFloat16 &&
                (opType.getVectorSize() == 2 || opType.getVectorSize() == 4)) {
                builder.addExtension(spv::E_SPV_NV_shader_atomic_fp16_vector);
                builder.addCapability(spv::CapabilityAtomicFloat16VectorNV);
            } else {
                builder.addExtension(spv::E_SPV_EXT_shader_atomic_float_add);
                if (typeProxy == glslang::EbtFloat16) {
                    builder.addExtension(spv::E_SPV_EXT_shader_atomic_float16_add);
                    builder.addCapability(spv::CapabilityAtomicFloat16AddEXT);
                } else if (typeProxy == glslang::EbtFloat) {
                    builder.addCapability(spv::CapabilityAtomicFloat32AddEXT);
                } else {
                    builder.addCapability(spv::CapabilityAtomicFloat64AddEXT);
                }
            }
        }
        break;
    case glslang::EOpAtomicSubtract:
    case glslang::EOpAtomicCounterSubtract:
        opCode = spv::OpAtomicISub;
        break;
    case glslang::EOpAtomicMin:
    case glslang::EOpImageAtomicMin:
    case glslang::EOpAtomicCounterMin:
        if (typeProxy == glslang::EbtFloat16 || typeProxy == glslang::EbtFloat || typeProxy == glslang::EbtDouble) {
            opCode = spv::OpAtomicFMinEXT;
            if (typeProxy == glslang::EbtFloat16 &&
                (opType.getVectorSize() == 2 || opType.getVectorSize() == 4)) {
                builder.addExtension(spv::E_SPV_NV_shader_atomic_fp16_vector);
                builder.addCapability(spv::CapabilityAtomicFloat16VectorNV);
            } else {
                builder.addExtension(spv::E_SPV_EXT_shader_atomic_float_min_max);
                if (typeProxy == glslang::EbtFloat16)
                    builder.addCapability(spv::CapabilityAtomicFloat16MinMaxEXT);
                else if (typeProxy == glslang::EbtFloat)
                    builder.addCapability(spv::CapabilityAtomicFloat32MinMaxEXT);
                else
                    builder.addCapability(spv::CapabilityAtomicFloat64MinMaxEXT);
            }
        } else if (typeProxy == glslang::EbtUint || typeProxy == glslang::EbtUint64) {
            opCode = spv::OpAtomicUMin;
        } else {
            opCode = spv::OpAtomicSMin;
        }
        break;
    case glslang::EOpAtomicMax:
    case glslang::EOpImageAtomicMax:
    case glslang::EOpAtomicCounterMax:
        if (typeProxy == glslang::EbtFloat16 || typeProxy == glslang::EbtFloat || typeProxy == glslang::EbtDouble) {
            opCode = spv::OpAtomicFMaxEXT;
            if (typeProxy == glslang::EbtFloat16 &&
                (opType.getVectorSize() == 2 || opType.getVectorSize() == 4)) {
                builder.addExtension(spv::E_SPV_NV_shader_atomic_fp16_vector);
                builder.addCapability(spv::CapabilityAtomicFloat16VectorNV);
            } else {
                builder.addExtension(spv::E_SPV_EXT_shader_atomic_float_min_max);
                if (typeProxy == glslang::EbtFloat16)
                    builder.addCapability(spv::CapabilityAtomicFloat16MinMaxEXT);
                else if (typeProxy == glslang::EbtFloat)
                    builder.addCapability(spv::CapabilityAtomicFloat32MinMaxEXT);
                else
                    builder.addCapability(spv::CapabilityAtomicFloat64MinMaxEXT);
            }
        } else if (typeProxy == glslang::EbtUint || typeProxy == glslang::EbtUint64) {
            opCode = spv::OpAtomicUMax;
        } else {
            opCode = spv::OpAtomicSMax;
        }
        break;
    case glslang::EOpAtomicAnd:
    case glslang::EOpImageAtomicAnd:
    case glslang::EOpAtomicCounterAnd:
        opCode = spv::OpAtomicAnd;
        break;
    case glslang::EOpAtomicOr:
    case glslang::EOpImageAtomicOr:
    case glslang::EOpAtomicCounterOr:
        opCode = spv::OpAtomicOr;
        break;
    case glslang::EOpAtomicXor:
    case glslang::EOpImageAtomicXor:
    case glslang::EOpAtomicCounterXor:
        opCode = spv::OpAtomicXor;
        break;
    case glslang::EOpAtomicExchange:
    case glslang::EOpImageAtomicExchange:
    case glslang::EOpAtomicCounterExchange:
        if ((typeProxy == glslang::EbtFloat16) && 
            (opType.getVectorSize() == 2 || opType.getVectorSize() == 4)) {
                builder.addExtension(spv::E_SPV_NV_shader_atomic_fp16_vector);
                builder.addCapability(spv::CapabilityAtomicFloat16VectorNV);
        }

        opCode = spv::OpAtomicExchange;
        break;
    case glslang::EOpAtomicCompSwap:
    case glslang::EOpImageAtomicCompSwap:
    case glslang::EOpAtomicCounterCompSwap:
        opCode = spv::OpAtomicCompareExchange;
        break;
    case glslang::EOpAtomicCounterIncrement:
        opCode = spv::OpAtomicIIncrement;
        break;
    case glslang::EOpAtomicCounterDecrement:
        opCode = spv::OpAtomicIDecrement;
        break;
    case glslang::EOpAtomicCounter:
    case glslang::EOpImageAtomicLoad:
    case glslang::EOpAtomicLoad:
        opCode = spv::OpAtomicLoad;
        break;
    case glslang::EOpAtomicStore:
    case glslang::EOpImageAtomicStore:
        opCode = spv::OpAtomicStore;
        break;
    default:
        assert(0);
        break;
    }

    if (typeProxy == glslang::EbtInt64 || typeProxy == glslang::EbtUint64)
        builder.addCapability(spv::CapabilityInt64Atomics);

    // Sort out the operands
    //  - mapping from glslang -> SPV
    //  - there are extra SPV operands that are optional in glslang
    //  - compare-exchange swaps the value and comparator
    //  - compare-exchange has an extra memory semantics
    //  - EOpAtomicCounterDecrement needs a post decrement
    spv::Id pointerId = 0, compareId = 0, valueId = 0;
    // scope defaults to Device in the old model, QueueFamilyKHR in the new model
    spv::Id scopeId;
    if (glslangIntermediate->usingVulkanMemoryModel()) {
        scopeId = builder.makeUintConstant(spv::ScopeQueueFamilyKHR);
    } else {
        scopeId = builder.makeUintConstant(spv::ScopeDevice);
    }
    // semantics default to relaxed
    spv::Id semanticsId = builder.makeUintConstant(lvalueCoherentFlags.isVolatile() &&
        glslangIntermediate->usingVulkanMemoryModel() ?
                                                    spv::MemorySemanticsVolatileMask :
                                                    spv::MemorySemanticsMaskNone);
    spv::Id semanticsId2 = semanticsId;

    pointerId = operands[0];
    if (opCode == spv::OpAtomicIIncrement || opCode == spv::OpAtomicIDecrement) {
        // no additional operands
    } else if (opCode == spv::OpAtomicCompareExchange) {
        compareId = operands[1];
        valueId = operands[2];
        if (operands.size() > 3) {
            scopeId = operands[3];
            semanticsId = builder.makeUintConstant(
                builder.getConstantScalar(operands[4]) | builder.getConstantScalar(operands[5]));
            semanticsId2 = builder.makeUintConstant(
                builder.getConstantScalar(operands[6]) | builder.getConstantScalar(operands[7]));
        }
    } else if (opCode == spv::OpAtomicLoad) {
        if (operands.size() > 1) {
            scopeId = operands[1];
            semanticsId = builder.makeUintConstant(
                builder.getConstantScalar(operands[2]) | builder.getConstantScalar(operands[3]));
        }
    } else {
        // atomic store or RMW
        valueId = operands[1];
        if (operands.size() > 2) {
            scopeId = operands[2];
            semanticsId = builder.makeUintConstant
                (builder.getConstantScalar(operands[3]) | builder.getConstantScalar(operands[4]));
        }
    }

    // Check for capabilities
    unsigned semanticsImmediate = builder.getConstantScalar(semanticsId) | builder.getConstantScalar(semanticsId2);
    if (semanticsImmediate & (spv::MemorySemanticsMakeAvailableKHRMask |
                              spv::MemorySemanticsMakeVisibleKHRMask |
                              spv::MemorySemanticsOutputMemoryKHRMask |
                              spv::MemorySemanticsVolatileMask)) {
        builder.addCapability(spv::CapabilityVulkanMemoryModelKHR);
    }

    if (builder.getConstantScalar(scopeId) == spv::ScopeQueueFamily) {
        builder.addCapability(spv::CapabilityVulkanMemoryModelKHR);
    }

    if (glslangIntermediate->usingVulkanMemoryModel() && builder.getConstantScalar(scopeId) == spv::ScopeDevice) {
        builder.addCapability(spv::CapabilityVulkanMemoryModelDeviceScopeKHR);
    }

    std::vector<spv::Id> spvAtomicOperands;  // hold the spv operands
    spvAtomicOperands.reserve(6);
    spvAtomicOperands.push_back(pointerId);
    spvAtomicOperands.push_back(scopeId);
    spvAtomicOperands.push_back(semanticsId);
    if (opCode == spv::OpAtomicCompareExchange) {
        spvAtomicOperands.push_back(semanticsId2);
        spvAtomicOperands.push_back(valueId);
        spvAtomicOperands.push_back(compareId);
    } else if (opCode != spv::OpAtomicLoad && opCode != spv::OpAtomicIIncrement && opCode != spv::OpAtomicIDecrement) {
        spvAtomicOperands.push_back(valueId);
    }

    if (opCode == spv::OpAtomicStore) {
        builder.createNoResultOp(opCode, spvAtomicOperands);
        return 0;
    } else {
        spv::Id resultId = builder.createOp(opCode, typeId, spvAtomicOperands);

        // GLSL and HLSL atomic-counter decrement return post-decrement value,
        // while SPIR-V returns pre-decrement value. Translate between these semantics.
        if (op == glslang::EOpAtomicCounterDecrement)
            resultId = builder.createBinOp(spv::OpISub, typeId, resultId, builder.makeIntConstant(1));

        return resultId;
    }
}